

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluShaderLibrary.cpp
# Opt level: O2

deUint32 __thiscall glu::sl::ShaderParser::getShaderStageLiteralFlag(ShaderParser *this)

{
  Token TVar1;
  deUint32 dVar2;
  undefined8 extraout_RAX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_28;
  
  TVar1 = this->m_curToken;
  if (TVar1 == TOKEN_VERTEX) {
    dVar2 = 1;
  }
  else if (TVar1 == TOKEN_GEOMETRY) {
    dVar2 = 4;
  }
  else if (TVar1 == TOKEN_TESSELLATION_CONTROL) {
    dVar2 = 8;
  }
  else if (TVar1 == TOKEN_TESSELLATION_EVALUATION) {
    dVar2 = 0x10;
  }
  else {
    if (TVar1 != TOKEN_FRAGMENT) {
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      local_68._M_string_length = 0;
      local_68.field_2._M_local_buf[0] = '\0';
      std::operator+(&local_48,&local_68,"invalid shader stage name, got ");
      std::operator+(&local_28,&local_48,&this->m_curTokenStr);
      parseError(this,&local_28);
      std::__cxx11::string::~string((string *)&local_28);
      std::__cxx11::string::~string((string *)&local_48);
      std::__cxx11::string::~string((string *)&local_68);
      _Unwind_Resume(extraout_RAX);
    }
    dVar2 = 2;
  }
  return dVar2;
}

Assistant:

deUint32 ShaderParser::getShaderStageLiteralFlag (void)
{
	switch (m_curToken)
	{
		case TOKEN_VERTEX:					return (1 << glu::SHADERTYPE_VERTEX);
		case TOKEN_FRAGMENT:				return (1 << glu::SHADERTYPE_FRAGMENT);
		case TOKEN_GEOMETRY:				return (1 << glu::SHADERTYPE_GEOMETRY);
		case TOKEN_TESSELLATION_CONTROL:	return (1 << glu::SHADERTYPE_TESSELLATION_CONTROL);
		case TOKEN_TESSELLATION_EVALUATION:	return (1 << glu::SHADERTYPE_TESSELLATION_EVALUATION);

		default:
			parseError(std::string() + "invalid shader stage name, got " + m_curTokenStr);
			return 0;
	}
}